

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

string_t __thiscall
duckdb::HexHugeIntOperator::Operation<duckdb::hugeint_t,duckdb::string_t>
          (HexHugeIntOperator *this,hugeint_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  long lVar2;
  ulong uVar3;
  HexHugeIntOperator *pHVar4;
  undefined4 *puVar5;
  char *pcVar6;
  HexHugeIntOperator *pHVar7;
  ulong uVar8;
  uint64_t upper;
  undefined1 auVar9 [16];
  string_t target;
  uint local_28;
  undefined4 uStack_24;
  char *local_20;
  
  pHVar7 = (HexHugeIntOperator *)input.lower;
  lVar2 = 0x3f;
  pHVar4 = pHVar7;
  if (((pHVar7 == (HexHugeIntOperator *)0x0) &&
      (lVar2 = 0x7f, pHVar4 = this, this == (HexHugeIntOperator *)0x0)) ||
     (uVar8 = (ulong)pHVar4 >> 1 | (ulong)pHVar4, uVar8 = uVar8 >> 2 | uVar8,
     uVar8 = uVar8 >> 4 | uVar8, uVar8 = uVar8 >> 8 | uVar8, uVar8 = uVar8 >> 0x10 | uVar8,
     uVar8 = (ulong)(lVar2 - *(long *)(&DAT_00779200 +
                                      ((uVar8 >> 0x20 | uVar8) * 0x3f79d71b4cb0a89 >> 0x3a) * 8)) >>
             2, uVar8 == 0x20)) {
    auVar9 = duckdb::StringVector::EmptyString((Vector *)input.upper,1);
    local_20 = auVar9._8_8_;
    local_28 = auVar9._0_4_;
    uStack_24 = auVar9._4_4_;
    puVar5 = (undefined4 *)local_20;
    if (local_28 < 0xd) {
      puVar5 = &uStack_24;
    }
    *(undefined1 *)puVar5 = 0x30;
    uVar8 = auVar9._0_8_ & 0xffffffff;
    if (uVar8 < 0xd) goto LAB_00763a0b;
  }
  else {
    uVar8 = 0x20 - uVar8;
    auVar9 = duckdb::StringVector::EmptyString((Vector *)input.upper,uVar8);
    local_20 = auVar9._8_8_;
    uVar3 = auVar9._0_8_;
    local_28 = auVar9._0_4_;
    uStack_24 = auVar9._4_4_;
    pcVar6 = local_20;
    if (local_28 < 0xd) {
      pcVar6 = (char *)&uStack_24;
    }
    uVar8 = uVar8 * 4;
    if (uVar8 < 0x44) {
      if (uVar8 != 0) goto LAB_007639d8;
    }
    else {
      do {
        *pcVar6 = "0123456789ABCDEF"[(uint)((long)pHVar7 >> ((char)uVar8 + 0xbcU & 0x3f)) & 0xf];
        pcVar6 = pcVar6 + 1;
        uVar8 = uVar8 - 4;
      } while (0x43 < uVar8);
LAB_007639d8:
      lVar2 = uVar8 - 4;
      do {
        *pcVar6 = "0123456789ABCDEF"[(uint)((ulong)this >> ((byte)lVar2 & 0x3f)) & 0xf];
        pcVar6 = pcVar6 + 1;
        lVar2 = lVar2 + -4;
      } while (lVar2 != -4);
      auVar9._8_8_ = local_20;
      auVar9._0_8_ = uVar3 & 0xffffffff;
    }
    local_20 = auVar9._8_8_;
    if (auVar9._0_4_ < 0xd) {
      uVar8 = auVar9._0_8_ & 0xffffffff;
LAB_00763a0b:
      memset((void *)((long)&uStack_24 + uVar8),0,0xc - uVar8);
      goto LAB_00763a2a;
    }
  }
  uStack_24 = *(undefined4 *)local_20;
LAB_00763a2a:
  aVar1._4_1_ = (undefined1)uStack_24;
  aVar1._5_1_ = uStack_24._1_1_;
  aVar1._6_1_ = uStack_24._2_1_;
  aVar1._7_1_ = uStack_24._3_1_;
  aVar1.pointer.length = local_28;
  aVar1.pointer.ptr = local_20;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		idx_t num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<hugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 2 - (num_leading_zero / 4);

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntHexBytes<hugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}